

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::(anonymous_namespace)::test<vk::VkCommandBuffer_s*>
          (TestStatus *__return_storage_ptr__,_anonymous_namespace_ *this,Context *context)

{
  size_t sVar1;
  DeviceInterface *vk;
  VkDevice device;
  VkAllocationCallbacks *pVVar2;
  VkCommandBuffer *pCmdBuffers;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_108;
  AllocationCallbackRecorder recordingAllocator;
  VkCommandBuffer pNullHandles [3];
  VkCommandPoolCreateInfo cmdPoolCreateInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_58;
  
  vk = Context::getDeviceInterface((Context *)this);
  device = Context::getDevice((Context *)this);
  cmdPoolCreateInfo.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  cmdPoolCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolCreateInfo.pNext = (void *)0x0;
  cmdPoolCreateInfo.flags = 1;
  pNullHandles[0] = (VkCommandBuffer)0x0;
  pNullHandles[1] = (VkCommandBuffer)0x0;
  pNullHandles[2] = (VkCommandBuffer)0x0;
  pCmdBuffers = (VkCommandBuffer *)0x0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_108,vk,device,&cmdPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation =
       (PFN_vkAllocationFunction)local_108.m_data.deleter.m_device;
  recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnReallocation =
       (PFN_vkReallocationFunction)local_108.m_data.deleter.m_allocator;
  recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)local_108.m_data.object.m_internal;
  recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData =
       local_108.m_data.deleter.m_deviceIface;
  local_108.m_data.object.m_internal = 0;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_108.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_108);
  api::anon_unknown_1::release
            ((Context *)this,device,
             (VkCommandPool)
             recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks.
             _vptr_AllocationCallbacks,(deUint32)pNullHandles,pCmdBuffers);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&recordingAllocator);
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&recordingAllocator,pVVar2,1);
  pVVar2 = &recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_58,vk,device,&cmdPoolCreateInfo,pVVar2)
  ;
  local_108.m_data.deleter.m_device = local_58.m_data.deleter.m_device;
  local_108.m_data.deleter.m_allocator = local_58.m_data.deleter.m_allocator;
  local_108.m_data.object.m_internal = local_58.m_data.object.m_internal;
  local_108.m_data.deleter.m_deviceIface = local_58.m_data.deleter.m_deviceIface;
  local_58.m_data.object.m_internal = 0;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_58.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_58);
  sVar1 = recordingAllocator.m_records.m_numElements;
  api::anon_unknown_1::release
            ((Context *)this,device,(VkCommandPool)local_108.m_data.object.m_internal,
             (deUint32)pNullHandles,(VkCommandBuffer *)pVVar2);
  api::anon_unknown_1::reportStatus
            (__return_storage_ptr__,sVar1 == recordingAllocator.m_records.m_numElements);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_108);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recordingAllocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test<VkCommandBuffer> (Context& context)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo	cmdPoolCreateInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,		// VkStructureType             sType;
		DE_NULL,										// const void*                 pNext;
		VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,			// VkCommandPoolCreateFlags    flags;
		queueFamilyIndex,								// uint32_t                    queueFamilyIndex;
	};

	const VkCommandBuffer			pNullHandles[]		= { DE_NULL, DE_NULL, DE_NULL };
	const deUint32					numHandles			= static_cast<deUint32>(DE_LENGTH_OF_ARRAY(pNullHandles));

	// Default allocator
	{
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo));

		release(context, device, *cmdPool, numHandles, pNullHandles);
	}

	// Custom allocator
	{
		AllocationCallbackRecorder		recordingAllocator	(getSystemAllocator(), 1u);
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo, recordingAllocator.getCallbacks()));
		const std::size_t				numInitialRecords	= recordingAllocator.getNumRecords();

		release(context, device, *cmdPool, numHandles, pNullHandles);

		return reportStatus(numInitialRecords == recordingAllocator.getNumRecords());
	}
}